

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDGAssemblyAnnotationWriter.h
# Opt level: O0

void __thiscall
dg::debug::LLVMDGAssemblyAnnotationWriter::emitBasicBlockStartAnnot
          (LLVMDGAssemblyAnnotationWriter *this,BasicBlock *B,formatted_raw_ostream *os)

{
  bool bVar1;
  pointer ppVar2;
  raw_ostream *prVar3;
  BBlock<dg::LLVMNode> *pBVar4;
  KeyT *ppVVar5;
  reference ppBVar6;
  undefined8 in_RSI;
  map<llvm::Value_*,_dg::LLVMDependenceGraph_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
  *in_RDI;
  LLVMBBlock *p_1;
  const_iterator __end5_1;
  const_iterator __begin5_1;
  BBlockContainerT *__range5_1;
  LLVMBBlock *P;
  LLVMBBlock *p;
  iterator __end5;
  iterator __begin5;
  BBlockContainerT *__range5;
  LLVMBBlock *BB;
  iterator I;
  BBlocksMapT *cb;
  LLVMDependenceGraph *sub;
  pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*> *it;
  const_iterator __end2;
  const_iterator __begin2;
  map<llvm::Value_*,_dg::LLVMDependenceGraph_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
  *__range2;
  BBlock<dg::LLVMNode> *in_stack_ffffffffffffff50;
  const_iterator in_stack_ffffffffffffff58;
  const_iterator in_stack_ffffffffffffff60;
  _Self local_80;
  _Self local_78;
  BBlockContainerT *local_70;
  BBlock<dg::LLVMNode> *local_68;
  _Self local_60;
  undefined8 local_58;
  _Self local_50;
  BBlocksMapT *local_48;
  DependenceGraph<dg::LLVMNode> *local_40;
  reference local_38;
  _Self local_30;
  _Self local_28;
  undefined8 local_20;
  undefined8 local_10;
  
  if (*(int *)(in_RDI + 8) != 0) {
    local_10 = in_RSI;
    local_20 = dg::getConstructedFunctions();
    local_28._M_node =
         (_Base_ptr)
         std::
         map<llvm::Value_*,_dg::LLVMDependenceGraph_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
         ::begin(in_RDI);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<llvm::Value_*,_dg::LLVMDependenceGraph_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
         ::end(in_RDI);
    while (bVar1 = std::operator!=(&local_28,&local_30), bVar1) {
      local_38 = std::
                 _Rb_tree_const_iterator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>
                 ::operator*((_Rb_tree_const_iterator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>
                              *)0x1beb18);
      local_40 = (DependenceGraph<dg::LLVMNode> *)local_38->second;
      local_48 = DependenceGraph<dg::LLVMNode>::getBlocks(local_40);
      local_58 = local_10;
      local_50._M_node =
           (_Base_ptr)
           std::
           map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
           ::find((map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
                   *)in_RDI,(key_type *)0x1beb5c);
      local_60._M_node =
           (_Base_ptr)
           std::
           map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
           ::end((map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
                  *)in_RDI);
      bVar1 = std::operator!=(&local_50,&local_60);
      if (bVar1) {
        ppVar2 = std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>
                               *)0x1beb92);
        local_68 = ppVar2->second;
        if ((*(uint *)(in_RDI + 8) & 0x24) != 0) {
          prVar3 = llvm::raw_ostream::operator<<
                             ((raw_ostream *)in_stack_ffffffffffffff60._M_node,
                              (char *)in_stack_ffffffffffffff58._M_node);
          llvm::raw_ostream::operator<<(prVar3,local_68);
          llvm::raw_ostream::operator<<
                    ((raw_ostream *)in_stack_ffffffffffffff60._M_node,
                     (char *)in_stack_ffffffffffffff58._M_node);
        }
        if ((*(uint *)(in_RDI + 8) & 0x20) != 0) {
          local_70 = BBlock<dg::LLVMNode>::getPostDomFrontiers(local_68);
          local_78._M_node =
               (_Base_ptr)
               DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>::begin
                         ((DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U> *)in_RDI);
          local_80._M_node =
               (_Base_ptr)
               DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>::end
                         ((DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U> *)in_RDI);
          while (bVar1 = std::operator!=(&local_78,&local_80), bVar1) {
            ppBVar6 = std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*>::operator*
                                ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*> *)0x1bec3c);
            pBVar4 = *ppBVar6;
            prVar3 = llvm::raw_ostream::operator<<
                               ((raw_ostream *)in_stack_ffffffffffffff60._M_node,
                                (char *)in_stack_ffffffffffffff58._M_node);
            llvm::raw_ostream::operator<<(prVar3,pBVar4);
            llvm::raw_ostream::operator<<
                      ((raw_ostream *)in_stack_ffffffffffffff60._M_node,
                       (char *)in_stack_ffffffffffffff58._M_node);
            std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*>::operator++
                      ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*> *)
                       in_stack_ffffffffffffff50);
          }
          pBVar4 = BBlock<dg::LLVMNode>::getIPostDom(local_68);
          if ((pBVar4 != (BBlock<dg::LLVMNode> *)0x0) &&
             (ppVVar5 = BBlock<dg::LLVMNode>::getKey(pBVar4), *ppVVar5 != (KeyT)0x0)) {
            prVar3 = llvm::raw_ostream::operator<<
                               ((raw_ostream *)in_stack_ffffffffffffff60._M_node,
                                (char *)in_stack_ffffffffffffff58._M_node);
            llvm::raw_ostream::operator<<(prVar3,pBVar4);
            llvm::raw_ostream::operator<<
                      ((raw_ostream *)in_stack_ffffffffffffff60._M_node,
                       (char *)in_stack_ffffffffffffff58._M_node);
          }
        }
        if ((*(uint *)(in_RDI + 8) & 4) != 0) {
          BBlock<dg::LLVMNode>::controlDependence(local_68);
          in_stack_ffffffffffffff60 =
               DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>::begin
                         ((DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U> *)in_RDI);
          in_stack_ffffffffffffff58 =
               DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>::end
                         ((DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U> *)in_RDI);
          while (bVar1 = std::operator!=((_Self *)&stack0xffffffffffffff60,
                                         (_Self *)&stack0xffffffffffffff58), bVar1) {
            ppBVar6 = std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*>::operator*
                                ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*> *)0x1bed38);
            in_stack_ffffffffffffff50 = *ppBVar6;
            prVar3 = llvm::raw_ostream::operator<<
                               ((raw_ostream *)in_stack_ffffffffffffff60._M_node,
                                (char *)in_stack_ffffffffffffff58._M_node);
            llvm::raw_ostream::operator<<(prVar3,in_stack_ffffffffffffff50);
            llvm::raw_ostream::operator<<
                      ((raw_ostream *)in_stack_ffffffffffffff60._M_node,
                       (char *)in_stack_ffffffffffffff58._M_node);
            std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*>::operator++
                      ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*> *)
                       in_stack_ffffffffffffff50);
          }
        }
      }
      std::_Rb_tree_const_iterator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>::
      operator++((_Rb_tree_const_iterator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>
                  *)in_stack_ffffffffffffff50);
    }
  }
  return;
}

Assistant:

void emitBasicBlockStartAnnot(const llvm::BasicBlock *B,
                                  llvm::formatted_raw_ostream &os) override {
        if (opts == 0)
            return;

        for (const auto &it : getConstructedFunctions()) {
            LLVMDependenceGraph *sub = it.second;
            auto &cb = sub->getBlocks();
            auto I = cb.find(const_cast<llvm::BasicBlock *>(B));
            if (I != cb.end()) {
                LLVMBBlock *BB = I->second;
                if (opts & (ANNOTATE_POSTDOM | ANNOTATE_CD))
                    os << "  ; BB: " << BB << "\n";

                if (opts & ANNOTATE_POSTDOM) {
                    for (LLVMBBlock *p : BB->getPostDomFrontiers())
                        os << "  ; PDF: " << p << "\n";

                    LLVMBBlock *P = BB->getIPostDom();
                    if (P && P->getKey())
                        os << "  ; iPD: " << P << "\n";
                }

                if (opts & ANNOTATE_CD) {
                    for (LLVMBBlock *p : BB->controlDependence())
                        os << "  ; CD: " << p << "\n";
                }
            }
        }
    }